

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O1

void __thiscall
QOpenGLProgramBinaryCache::save(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char16_t *pcVar4;
  undefined1 *puVar5;
  Data *pDVar6;
  char *pcVar7;
  uint uVar8;
  qsizetype __n;
  qsizetype __n_00;
  qsizetype __n_01;
  QArrayData *pQVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  QOpenGLContext *this_00;
  QOpenGLExtraFunctions *pQVar16;
  undefined8 *puVar17;
  ulong uVar18;
  char *pcVar19;
  char *__s;
  int iVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  QStringView QVar22;
  QStringView QVar23;
  GLint outSize;
  quint32 blobFormat;
  GLint blobSize;
  GLEnvInfo info;
  QArrayData *local_110;
  undefined8 *local_108;
  QString local_f8;
  uint local_e0;
  undefined4 local_dc;
  QByteArray local_d8;
  QString local_b8;
  char *local_a0;
  uint local_8c;
  GLEnvInfo local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_cacheWritable != true) goto LAB_0056cc0b;
  local_88.glversion.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glversion.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glversion.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glrenderer.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.glvendor.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b56d22::GLEnvInfo::GLEnvInfo(&local_88);
  this_00 = QOpenGLContext::currentContext();
  pQVar16 = QOpenGLContext::extraFunctions(this_00);
  local_8c = 0;
  do {
    iVar13 = (*(((pQVar16->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    if (iVar13 == 0x507) break;
  } while (iVar13 != 0);
  (*(((pQVar16->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x55])
            ((ulong)programId,0x8741,&local_8c);
  __n_01 = local_88.glversion.d.size;
  __n_00 = local_88.glrenderer.d.size;
  __n = local_88.glvendor.d.size;
  iVar13 = (int)local_88.glrenderer.d.size;
  iVar3 = (int)local_88.glvendor.d.size;
  iVar20 = iVar13 + iVar3;
  iVar14 = (int)local_88.glversion.d.size;
  uVar18 = (long)(iVar14 + iVar20 + 0x27) & 0xfffffffffffffffc;
  uVar21 = (long)(int)local_8c + uVar18;
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  uVar8 = local_8c;
  if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
             _q_value._M_base._M_i & 1) != 0) {
    local_b8.d.d._0_4_ = 2;
    local_b8.d.d._4_4_ = 0;
    local_b8.d.ptr._0_4_ = 0;
    local_b8.d.ptr._4_4_ = 0;
    local_b8.d.size._0_4_ = 0;
    local_b8.d.size._4_4_ = 0;
    local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    uVar15 = (*(((pQVar16->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    QMessageLogger::debug
              ((char *)&local_b8,"Program binary is %d bytes, err = 0x%x, total %d",(ulong)uVar8,
               (ulong)uVar15,uVar21 & 0xffffffff);
  }
  if (local_8c != 0) {
    iVar20 = (int)uVar18 - (iVar14 + iVar20 + 0x1c);
    local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_d8,uVar21,Uninitialized);
    if ((&(local_d8.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_d8,(AllocationOption)local_d8.d.size);
    }
    pcVar7 = local_d8.d.ptr;
    local_d8.d.ptr[0] = 't';
    local_d8.d.ptr[1] = 'Q';
    local_d8.d.ptr[2] = '\0';
    local_d8.d.ptr[3] = '\0';
    local_d8.d.ptr[4] = '\x03';
    local_d8.d.ptr[5] = '\0';
    local_d8.d.ptr[6] = '\0';
    local_d8.d.ptr[7] = '\0';
    local_d8.d.ptr[8] = '\0';
    local_d8.d.ptr[9] = '\n';
    local_d8.d.ptr[10] = '\x06';
    local_d8.d.ptr[0xb] = '\0';
    local_d8.d.ptr[0xc] = '\b';
    local_d8.d.ptr[0xd] = '\0';
    local_d8.d.ptr[0xe] = '\0';
    local_d8.d.ptr[0xf] = '\0';
    *(int *)(local_d8.d.ptr + 0x10) = iVar3;
    pcVar19 = local_88.glvendor.d.ptr;
    if (local_88.glvendor.d.ptr == (char *)0x0) {
      pcVar19 = (char *)&QByteArray::_empty;
    }
    memcpy(local_d8.d.ptr + 0x14,pcVar19,__n);
    *(int *)(pcVar7 + (long)(__n + 0x14)) = iVar13;
    pcVar19 = local_88.glrenderer.d.ptr;
    if (local_88.glrenderer.d.ptr == (char *)0x0) {
      pcVar19 = (char *)&QByteArray::_empty;
    }
    memcpy(pcVar7 + (long)(__n + 0x18),pcVar19,__n_00);
    *(int *)(pcVar7 + (long)((undefined1 *)(__n_00 + 8) + (long)(__n + 0x14)) + -4) = iVar14;
    pcVar19 = local_88.glversion.d.ptr;
    if (local_88.glversion.d.ptr == (char *)0x0) {
      pcVar19 = (char *)&QByteArray::_empty;
    }
    memcpy(pcVar7 + (long)((undefined1 *)(__n_00 + 8) + (long)(__n + 0x14)),pcVar19,__n_01);
    local_dc = 0;
    puVar5 = (undefined1 *)(__n_01 + (long)((undefined1 *)(__n_00 + (long)(__n + 0x14)) + 4));
    __s = pcVar7 + (long)(puVar5 + 0xc);
    pcVar19 = pcVar7 + (long)(puVar5 + 4);
    pcVar19[0] = '\0';
    pcVar19[1] = '\0';
    pcVar19[2] = '\0';
    pcVar19[3] = '\0';
    *(uint *)(pcVar7 + (long)(puVar5 + 8)) = local_8c;
    if (0 < iVar20 + -8) {
      uVar18 = (ulong)(iVar20 - 9);
      memset(__s,0,uVar18 + 1);
      __s = pcVar7 + (long)((undefined1 *)(__n_00 + __n) + __n_01 + uVar18 + 0x25);
    }
    local_e0 = 0;
    (*(pQVar16->super_QOpenGLFunctions).d_ptr[1].field_0.functions[0x60])
              ((ulong)programId,(ulong)local_8c,&local_e0,&local_dc,__s);
    if (local_8c == local_e0) {
      *(undefined4 *)
       (pcVar7 + (long)((undefined1 *)
                        (__n_01 + (long)((undefined1 *)(__n_00 + (long)(__n + 0x14)) + 4)) + 4)) =
           local_dc;
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      cacheFileName(&local_f8,this,cacheKey);
      local_b8.d.d._0_4_ = 0xaaaaaaaa;
      local_b8.d.d._4_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_b8.d.ptr._4_4_ = 0xaaaaaaaa;
      QSaveFile::QSaveFile((QSaveFile *)&local_b8,&local_f8);
      cVar10 = QSaveFile::open((QSaveFile *)&local_b8,10);
      if (cVar10 == '\0') {
LAB_0056c8d3:
        bVar12 = false;
      }
      else {
        QIODevice::write((QByteArray *)&local_b8);
        cVar10 = QSaveFile::commit();
        bVar12 = true;
        if (cVar10 == '\0') goto LAB_0056c8d3;
      }
      QSaveFile::~QSaveFile((QSaveFile *)&local_b8);
      if (bVar12 == false) {
        lVar1 = (this->m_currentCacheDir).d.size;
        lVar2 = (this->m_globalCacheDir).d.size;
        if (lVar1 == lVar2) {
          QVar22.m_data = (this->m_currentCacheDir).d.ptr;
          QVar22.m_size = lVar1;
          QVar23.m_data = (this->m_globalCacheDir).d.ptr;
          QVar23.m_size = lVar2;
          cVar10 = QtPrivate::equalStrings(QVar22,QVar23);
          if (cVar10 != '\0') {
            QString::operator=(&this->m_currentCacheDir,&this->m_localCacheDir);
            bVar11 = qt_ensureWritableDir(&this->m_currentCacheDir);
            this->m_cacheWritable = bVar11;
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.
                       enabledDebug._q_value._M_base._M_i & 1) != 0) {
              local_b8.d.d._0_4_ = 2;
              local_b8.d.d._4_4_ = 0;
              local_b8.d.ptr._0_4_ = 0;
              local_b8.d.ptr._4_4_ = 0;
              local_b8.d.size._0_4_ = 0;
              local_b8.d.size._4_4_ = 0;
              local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
              QString::toLocal8Bit_helper
                        ((QChar *)&local_110,(longlong)(this->m_currentCacheDir).d.ptr);
              puVar17 = local_108;
              if (local_108 == (undefined8 *)0x0) {
                puVar17 = &QByteArray::_empty;
              }
              QMessageLogger::debug
                        ((char *)&local_b8,"Cache location changed to \'%s\' writable = %d",puVar17,
                         (ulong)this->m_cacheWritable);
              if (local_110 != (QArrayData *)0x0) {
                LOCK();
                (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_110,1,0x10);
                }
              }
            }
            if (this->m_cacheWritable != false) {
              cacheFileName(&local_b8,this,cacheKey);
              pDVar6 = local_f8.d.d;
              pQVar9 = (QArrayData *)CONCAT44(local_b8.d.d._4_4_,local_b8.d.d._0_4_);
              pcVar4 = (char16_t *)CONCAT44(local_b8.d.ptr._4_4_,local_b8.d.ptr._0_4_);
              local_b8.d.d._0_4_ = SUB84(local_f8.d.d,0);
              local_b8.d.d._4_4_ = (undefined4)((ulong)local_f8.d.d >> 0x20);
              puVar5 = (undefined1 *)CONCAT44(local_b8.d.size._4_4_,(undefined4)local_b8.d.size);
              local_b8.d.ptr._0_4_ = SUB84(local_f8.d.ptr,0);
              local_b8.d.ptr._4_4_ = (undefined4)((ulong)local_f8.d.ptr >> 0x20);
              local_b8.d.size._0_4_ = (undefined4)local_f8.d.size;
              local_b8.d.size._4_4_ = (undefined4)((ulong)local_f8.d.size >> 0x20);
              local_f8.d.ptr = pcVar4;
              local_f8.d.size = (qsizetype)puVar5;
              if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  local_f8.d.d = (Data *)pQVar9;
                  QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
                  pQVar9 = &(local_f8.d.d)->super_QArrayData;
                }
              }
              local_f8.d.d = (Data *)pQVar9;
              bVar12 = writeFile(&local_f8,&local_d8);
            }
          }
        }
      }
      if (bVar12 == false) {
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          local_b8.d.d._0_4_ = 2;
          local_b8.d.d._4_4_ = 0;
          local_b8.d.ptr._0_4_ = 0;
          local_b8.d.ptr._4_4_ = 0;
          local_b8.d.size._0_4_ = 0;
          local_b8.d.size._4_4_ = 0;
          local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          QString::toLocal8Bit_helper((QChar *)&local_110,(longlong)local_f8.d.ptr);
          if (local_108 == (undefined8 *)0x0) {
            local_108 = &QByteArray::_empty;
          }
          QMessageLogger::debug((char *)&local_b8,"Failed to write %s to shader cache",local_108);
          if (local_110 != (QArrayData *)0x0) {
            LOCK();
            (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_110,1,0x10);
            }
          }
        }
      }
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) != 0) {
        local_b8.d.d._0_4_ = 2;
        local_b8.d.d._4_4_ = 0;
        local_b8.d.ptr._0_4_ = 0;
        local_b8.d.ptr._4_4_ = 0;
        local_b8.d.size._0_4_ = 0;
        local_b8.d.size._4_4_ = 0;
        local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        QMessageLogger::debug
                  ((char *)&local_b8,"glGetProgramBinary returned size %d instead of %d",
                   (ulong)local_e0,(ulong)local_8c);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_88.glversion.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glversion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.glversion.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.glrenderer.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glrenderer.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_88.glrenderer.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.glvendor.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.glvendor.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.glvendor.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0056cc0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLProgramBinaryCache::save(const QByteArray &cacheKey, uint programId)
{
    if (!m_cacheWritable)
        return;

    GLEnvInfo info;

    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    GLint blobSize = 0;
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
    funcs->glGetProgramiv(programId, GL_PROGRAM_BINARY_LENGTH, &blobSize);

    const int headerSize = FULL_HEADER_SIZE(info.glvendor.size() + info.glrenderer.size() + info.glversion.size());

    // Add padding to make the blob start 4-byte aligned in order to support
    // OpenGL implementations on ARM that choke on non-aligned pointers passed
    // to glProgramBinary.
    const int paddingSize = PADDING_SIZE(headerSize);

    const int totalSize = headerSize + paddingSize + blobSize;

    qCDebug(lcOpenGLProgramDiskCache, "Program binary is %d bytes, err = 0x%x, total %d", blobSize, funcs->glGetError(), totalSize);
    if (!blobSize)
        return;

    QByteArray blob(totalSize, Qt::Uninitialized);
    uchar *p = reinterpret_cast<uchar *>(blob.data());

    writeUInt(&p, BINSHADER_MAGIC);
    writeUInt(&p, BINSHADER_VERSION);
    writeUInt(&p, BINSHADER_QTVERSION);
    writeUInt(&p, sizeof(quintptr));

    writeStr(&p, info.glvendor);
    writeStr(&p, info.glrenderer);
    writeStr(&p, info.glversion);

    quint32 blobFormat = 0;
    uchar *blobFormatPtr = p;
    writeUInt(&p, blobFormat);
    writeUInt(&p, blobSize);

    for (int i = 0; i < paddingSize; ++i)
        *p++ = 0;

    GLint outSize = 0;
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        QMutexLocker lock(&m_mutex);
        initializeProgramBinaryOES(context);
        getProgramBinaryOES(programId, blobSize, &outSize, &blobFormat, p);
    } else
#endif
    funcs->glGetProgramBinary(programId, blobSize, &outSize, &blobFormat, p);
    if (blobSize != outSize) {
        qCDebug(lcOpenGLProgramDiskCache, "glGetProgramBinary returned size %d instead of %d", outSize, blobSize);
        return;
    }

    writeUInt(&blobFormatPtr, blobFormat);

    QString filename = cacheFileName(cacheKey);
    bool ok = writeFile(filename, blob);
    if (!ok && m_currentCacheDir == m_globalCacheDir) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
        qCDebug(lcOpenGLProgramDiskCache, "Cache location changed to '%s' writable = %d",
                qPrintable(m_currentCacheDir), m_cacheWritable);
        if (m_cacheWritable) {
            filename = cacheFileName(cacheKey);
            ok = writeFile(filename, blob);
        }
    }
    if (!ok)
        qCDebug(lcOpenGLProgramDiskCache, "Failed to write %s to shader cache", qPrintable(filename));
}